

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

int __thiscall
CTcTokenizer::expand_macros
          (CTcTokenizer *this,CTcTokString *srcbuf,utf8_ptr *src,CTcTokString *expbuf,int read_more,
          int allow_defined,int append)

{
  tok_embed_ctx *ec;
  char *pcVar1;
  char *pcVar2;
  tc_toktyp_t tVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  CTcMacroRsc *rsc;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  size_t sVar7;
  undefined4 in_register_00000084;
  undefined4 in_register_0000008c;
  long lVar8;
  utf8_ptr *local_e8;
  size_t local_e0;
  char **local_d0;
  int expanded;
  size_t *local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  size_t local_98;
  long local_90;
  size_t local_88;
  CTcTokStringRef local_srcbuf;
  utf8_ptr local_src;
  CTcToken tok;
  CTcHashEntryPp *entry;
  
  local_a8 = CONCAT44(in_register_0000008c,allow_defined);
  local_a0 = CONCAT44(in_register_00000084,read_more);
  local_src.p_ = (char *)0x0;
  local_srcbuf.super_CTcTokString._vptr_CTcTokString = (_func_int **)&PTR__CTcTokStringRef_00358a38;
  local_srcbuf.super_CTcTokString.buf_ = (char *)0x0;
  local_srcbuf.super_CTcTokString.buf_size_ = 0;
  local_srcbuf.super_CTcTokString.buf_len_ = 0;
  rsc = alloc_macro_rsc(this);
  if (rsc == (CTcMacroRsc *)0x0) {
    iVar6 = 1;
  }
  else {
    local_e8 = src;
    if (srcbuf == (CTcTokString *)0x0) {
      local_d0 = &local_srcbuf.super_CTcTokString.buf_;
      pcVar1 = src->p_;
      local_srcbuf.super_CTcTokString.buf_len_ = strlen(pcVar1);
      local_srcbuf.super_CTcTokString.buf_size_ = local_srcbuf.super_CTcTokString.buf_len_ + 1;
      srcbuf = &local_srcbuf.super_CTcTokString;
      local_b0 = &local_srcbuf.super_CTcTokString.buf_len_;
      local_srcbuf.super_CTcTokString.buf_ = pcVar1;
    }
    else {
      local_d0 = &srcbuf->buf_;
      local_b0 = &srcbuf->buf_len_;
      if (src == (utf8_ptr *)0x0) {
        local_src.p_ = *local_d0;
        local_e8 = &local_src;
      }
    }
    if (append == 0) {
      (*expbuf->_vptr_CTcTokString[9])();
    }
    (*expbuf->_vptr_CTcTokString[2])(expbuf,*local_b0 + expbuf->buf_len_);
    pcVar1 = local_e8->p_;
    pcVar2 = *local_d0;
    ec = &this->macro_in_embedding_;
    iVar6 = 1;
    tVar3 = next_on_line(srcbuf,local_e8,&tok,ec,1);
    local_e0 = (long)pcVar1 - (long)pcVar2;
LAB_0024c3f1:
    while (sVar7 = tok.text_len_, pcVar1 = tok.text_, tVar3 != TOKT_SYM) {
      if (tVar3 == TOKT_EOF) {
        iVar6 = 0;
        (*expbuf->_vptr_CTcTokString[4])
                  (expbuf,*local_d0 + local_e0,tok.text_ + (-(long)*local_d0 - local_e0));
        goto LAB_0024c6bb;
      }
LAB_0024c494:
      tVar3 = next_on_line(srcbuf,local_e8,&tok,ec,1);
    }
    if ((tok._32_1_ & 1) != 0) goto LAB_0024c494;
    iVar4 = (*this->defines_->_vptr_CTcMacroTable[4])(this->defines_,tok.text_,tok.text_len_);
    entry = (CTcHashEntryPp *)CONCAT44(extraout_var,iVar4);
    if ((entry == (CTcHashEntryPp *)0x0) ||
       (iVar4 = scan_for_prior_expansion((utf8_ptr)local_e8->p_,*local_d0 + *local_b0,entry),
       iVar4 != 0)) {
      if ((sVar7 != 7 || (int)local_a8 == 0) || (iVar4 = bcmp(pcVar1,"defined",7), iVar4 != 0))
      goto LAB_0024c494;
      sVar7 = (long)pcVar1 - (long)*local_d0;
      if (entry != (CTcHashEntryPp *)0x0) goto LAB_0024c4d1;
      iVar4 = expand_defined(this,&rsc->line_exp_,srcbuf,local_e8);
      expanded = 1;
    }
    else {
      sVar7 = (long)pcVar1 - (long)*local_d0;
LAB_0024c4d1:
      iVar4 = expand_macro(this,rsc,&rsc->line_exp_,srcbuf,local_e8,sVar7,entry,(int)local_a0,
                           (int)local_a8,&expanded);
    }
    if (iVar4 != 0) goto LAB_0024c6bb;
    if (expanded == 0) {
      tVar3 = next_on_line(srcbuf,local_e8,&tok,ec,1);
      goto LAB_0024c3f1;
    }
    (*expbuf->_vptr_CTcTokString[4])(expbuf,*local_d0 + local_e0,sVar7 - local_e0);
    lVar8 = (long)local_e8->p_ - (long)*local_d0;
    if ((int)local_a0 != 0) {
      local_90 = (*local_b0 - lVar8) + sVar7;
      local_88 = *local_b0 - lVar8;
      (*srcbuf->_vptr_CTcTokString[2])(srcbuf,(rsc->line_exp_).buf_len_ + local_90);
      iVar4 = (*srcbuf->_vptr_CTcTokString[10])();
      local_e8->p_ = (char *)(CONCAT44(extraout_var_00,iVar4) + sVar7);
      iVar4 = (*srcbuf->_vptr_CTcTokString[10])();
      local_98 = (rsc->line_exp_).buf_len_;
      iVar5 = (*srcbuf->_vptr_CTcTokString[10])();
      memmove((void *)(CONCAT44(extraout_var_01,iVar4) + sVar7 + local_98),
              (void *)(CONCAT44(extraout_var_02,iVar5) + lVar8),local_88);
      iVar4 = (*srcbuf->_vptr_CTcTokString[10])();
      iVar5 = (*(rsc->line_exp_)._vptr_CTcTokString[10])();
      memcpy((void *)(CONCAT44(extraout_var_03,iVar4) + sVar7),
             (void *)CONCAT44(extraout_var_04,iVar5),(rsc->line_exp_).buf_len_);
      (*srcbuf->_vptr_CTcTokString[0xb])(srcbuf,local_90 + (rsc->line_exp_).buf_len_);
      tVar3 = next_on_line(srcbuf,local_e8,&tok,ec,1);
      local_e0 = sVar7;
      goto LAB_0024c3f1;
    }
    (*(rsc->line_exp_)._vptr_CTcTokString[4])(rsc,*local_d0 + lVar8);
    iVar6 = expand_macros(this,&rsc->line_exp_,(utf8_ptr *)0x0,expbuf,0,(int)local_a8,1);
LAB_0024c6bb:
    rsc->next_avail_ = this->macro_res_avail_;
    this->macro_res_avail_ = rsc;
  }
  CTcTokStringRef::~CTcTokStringRef(&local_srcbuf);
  return iVar6;
}

Assistant:

int CTcTokenizer::expand_macros(CTcTokString *srcbuf, utf8_ptr *src,
                                CTcTokString *expbuf, int read_more,
                                int allow_defined, int append)
{
    tc_toktyp_t typ;
    CTcToken tok;
    CTcTokString *subexp;
    size_t startofs;
    utf8_ptr local_src;
    CTcTokStringRef local_srcbuf;
    CTcMacroRsc *res;
    int err;

    /* presume success */
    err = 0;

    /* get a macro expansion resource object */
    res = alloc_macro_rsc();
    if (res == 0)
        return 1;

    /* get our subexpression buffer from the resource object */
    subexp = &res->line_exp_;

    /* if there's no source buffer or source pointer, provide one */
    if (srcbuf == 0)
    {
        /* 
         *   there's no source buffer - provide our own non-allocated
         *   buffer tied to the caller's buffer 
         */
        local_srcbuf.set_buffer(src->getptr(), strlen(src->getptr()));
        srcbuf = &local_srcbuf;
    }
    else if (src == 0)
    {
        /* 
         *   there's no source pointer - start at the beginning of the
         *   source buffer 
         */
        local_src.set((char *)srcbuf->get_text());
        src = &local_src;
    }

    /* clear the expansion buffer, unless we're appending to the buffer */
    if (!append)
        expbuf->clear_text();

    /* 
     *   Make sure we have room for a copy of the source line.  This is an
     *   optimization for the simple case where we'll just copy the source
     *   line unchanged, so that we don't have to repeatedly expand the
     *   buffer; we will, however, expand the buffer dynamically later, if
     *   this pre-allocation should prove to be insufficient. 
     */
    expbuf->ensure_space(expbuf->get_text_len() + srcbuf->get_text_len());

    /* note the starting offset, if we have an underlying string buffer */
    startofs = src->getptr() - srcbuf->get_text();

    /* read the first token */
    typ = next_on_line(srcbuf, src, &tok, &macro_in_embedding_, TRUE);

    /* scan through the tokens on the line, looking for macros to expand */
    while (typ != TOKT_EOF)
    {
        /* 
         *   if it's a symbol, and it hasn't already been marked as fully
         *   expanded, look it up in the #define table 
         */
        if (typ == TOKT_SYM && !tok.get_fully_expanded())
        {
            CTcHashEntryPp *entry;

            /*
             *   Look up the symbol in the #define symbol table.  If we
             *   find it, expand the macro.  Otherwise, if the "defined"
             *   operator is active, check for that.
             *   
             *   Do not expand the macro if we find that it has already
             *   been expanded on a prior scan through the current text.  
             */
            entry = find_define(tok.get_text(), tok.get_text_len());
            if ((entry != 0
                 && !scan_for_prior_expansion(*src, srcbuf->get_text_end(),
                                              entry))
                || (allow_defined
                    && tok.get_text_len() == 7
                    && memcmp(tok.get_text(), "defined", 7) == 0))
            {
                size_t macro_ofs;
                size_t rem_len;
                int expanded;

                /* get the offset of the macro token in the source buffer */
                macro_ofs = tok.get_text() - srcbuf->get_text();
                
                /* expand it into our sub-expansion buffer */
                if (entry != 0)
                {
                    /* expand the macro */
                    err = expand_macro(res, subexp, srcbuf, src,
                                       macro_ofs, entry,
                                       read_more, allow_defined, &expanded);
                }
                else
                {
                    /* parse and expand the defined() operator */
                    err = expand_defined(subexp, srcbuf, src);

                    /* "defined" always expands if there's not an error */
                    expanded = TRUE;
                }

                /* if an error occurred, return failure */
                if (err)
                    goto done;

                /*
                 *   if we expanded something, append everything we
                 *   skipped preceding the macro, then rescan; otherwise,
                 *   just keep going without a rescan 
                 */
                if (expanded)
                {
                    /* copy the preceding text to the output */
                    expbuf->append(srcbuf->get_text() + startofs,
                                   macro_ofs - startofs);
                }
                else
                {
                    /* 
                     *   we didn't expand - get the next token after the
                     *   macro 
                     */
                    typ = next_on_line(srcbuf, src, &tok,
                                       &macro_in_embedding_, TRUE);

                    /* continue processing from this token */
                    continue;
                }

                /*
                 *   We must now insert the expansion into the source
                 *   buffer at the current point, and re-scan the
                 *   expansion, *along with* the rest of the original
                 *   source line (this is how ANSI C specifies the
                 *   process).
                 *   
                 *   If we can read more, we must be reading out of the
                 *   main input line buffer, so insert the expansion text
                 *   directly into the original source stream, and
                 *   continue reading out of the source stream; this will
                 *   simplify the case where we must read more data from
                 *   the file in the course of the expansion.  If we can't
                 *   read more, simply copy the remainder of the current
                 *   input line onto the expanded macro and use it as the
                 *   new input buffer.  
                 */

                /* get the current offset in the source line */
                startofs = src->getptr() - srcbuf->get_text();

                /* figure out how much is left on the current line */
                rem_len = srcbuf->get_text_len() - startofs;

                /* check to see if we can read more */
                if (read_more)
                {
                    /*
                     *   we're reading from the original line input buffer
                     *   -- insert the expansion into the source buffer at
                     *   the current point, replacing the original macro
                     *   text
                     */
                    
                    /* make sure we have room for adding the expansion text */
                    srcbuf->ensure_space(macro_ofs + rem_len
                                         + subexp->get_text_len());

                    /* make sure src is still pointing to the right place */
                    src->set(srcbuf->get_buf() + macro_ofs);
                
                    /* move the remainder of the current line to make room */
                    memmove(srcbuf->get_buf() + macro_ofs
                            + subexp->get_text_len(),
                            srcbuf->get_buf() + startofs,
                            rem_len);
                
                    /* insert the expansion text */
                    memcpy(srcbuf->get_buf() + macro_ofs, subexp->get_buf(),
                           subexp->get_text_len());
                
                    /* set the new source length */
                    srcbuf->set_text_len(macro_ofs + rem_len
                                         + subexp->get_text_len());

                    /* the new starting offset is the current position */
                    startofs = macro_ofs;

                    /* get the next token */
                    typ = next_on_line(srcbuf, src, &tok,
                                       &macro_in_embedding_, TRUE);
                    
                    /* continue processing from this token */
                    continue;
                }
                else
                {
                    /* 
                     *   we're reading from a read-only buffer -- add the
                     *   remainder of the source to the expansion buffer,
                     *   and recursively parse the remainder 
                     */
                    subexp->append(srcbuf->get_text() + startofs, rem_len);

                    /* 
                     *   evaluate the remainder recursively and append it
                     *   to the expansion already in progress 
                     */
                    err = expand_macros(subexp, 0, expbuf, FALSE,
                                        allow_defined, TRUE);

                    /* we're done */
                    goto done;
                }
            }
        }

        /* get the next token */
        typ = next_on_line(srcbuf, src, &tok, &macro_in_embedding_, TRUE);
    }

    /* add the remainder of the source to the output */
    expbuf->append(srcbuf->get_text() + startofs,
                   tok.get_text() - startofs - srcbuf->get_text());

done:
    /* release our macro resource object */
    release_macro_rsc(res);
    
    /* return the result */
    return err;
}